

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonValueWriter::writeImpl(JsonValueWriter *this,StringRef value,bool quote)

{
  char cVar1;
  const_iterator pcVar2;
  byte in_CL;
  undefined8 *in_RDI;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  StringRef *__range1;
  char *local_30;
  StringRef local_10;
  
  if ((in_CL & 1) != 0) {
    std::operator<<((ostream *)*in_RDI,'\"');
  }
  local_30 = StringRef::begin(&local_10);
  pcVar2 = StringRef::end(&local_10);
  for (; local_30 != pcVar2; local_30 = local_30 + 1) {
    cVar1 = *local_30;
    if (cVar1 == '\"') {
      std::operator<<((ostream *)*in_RDI,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::operator<<((ostream *)*in_RDI,"\\\\");
    }
    else if (cVar1 == '\b') {
      std::operator<<((ostream *)*in_RDI,"\\b");
    }
    else if (cVar1 == '\f') {
      std::operator<<((ostream *)*in_RDI,"\\f");
    }
    else if (cVar1 == '\n') {
      std::operator<<((ostream *)*in_RDI,"\\n");
    }
    else if (cVar1 == '\r') {
      std::operator<<((ostream *)*in_RDI,"\\r");
    }
    else if (cVar1 == '\t') {
      std::operator<<((ostream *)*in_RDI,"\\t");
    }
    else {
      std::operator<<((ostream *)*in_RDI,cVar1);
    }
  }
  if ((in_CL & 1) != 0) {
    std::operator<<((ostream *)*in_RDI,'\"');
  }
  return;
}

Assistant:

void JsonValueWriter::writeImpl( Catch::StringRef value, bool quote ) {
        if ( quote ) { m_os << '"'; }
        for (char c : value) {
            // Escape list taken from https://www.json.org/json-en.html,
            // string definition.
            // Note that while forward slash _can_ be escaped, it does
            // not have to be, if JSON is not further embedded somewhere
            // where forward slash is meaningful.
            if ( c == '"' ) {
                m_os << "\\\"";
            } else if ( c == '\\' ) {
                m_os << "\\\\";
            } else if ( c == '\b' ) {
                m_os << "\\b";
            } else if ( c == '\f' ) {
                m_os << "\\f";
            } else if ( c == '\n' ) {
                m_os << "\\n";
            } else if ( c == '\r' ) {
                m_os << "\\r";
            } else if ( c == '\t' ) {
                m_os << "\\t";
            } else {
                m_os << c;
            }
        }
        if ( quote ) { m_os << '"'; }
    }